

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O0

int ncnn::binary_op_no_broadcast<ncnn::BinaryOp_x86_functor::binary_op_add>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  undefined1 auVar1 [16];
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  float fVar2;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  __m128 afVar3;
  __m128 _outp;
  __m128 _p1;
  __m128 _p;
  int i;
  float *outptr;
  float *ptr1;
  float *ptr;
  int q;
  int size;
  int channels;
  binary_op_add op;
  Mat *m_1;
  Mat *m;
  Mat *m_2;
  undefined8 uStack_380;
  float local_378 [2];
  float afStack_370 [2];
  float local_368 [2];
  float afStack_360 [5];
  int local_34c;
  undefined8 local_348;
  undefined8 local_340;
  undefined8 local_338;
  undefined4 local_330;
  long local_328;
  undefined4 local_320;
  undefined4 local_31c;
  undefined4 local_318;
  undefined4 local_314;
  undefined4 local_310;
  undefined8 local_308;
  float *local_300;
  undefined8 local_2f8;
  undefined8 local_2f0;
  undefined8 local_2e8;
  undefined4 local_2e0;
  long local_2d8;
  undefined4 local_2d0;
  undefined4 local_2cc;
  undefined4 local_2c8;
  undefined4 local_2c4;
  undefined4 local_2c0;
  undefined8 local_2b8;
  float *local_2b0;
  undefined8 local_2a8;
  undefined8 local_2a0;
  undefined8 local_298;
  undefined4 local_290;
  long local_288;
  undefined4 local_280;
  undefined4 local_27c;
  undefined4 local_278;
  undefined4 local_274;
  undefined4 local_270;
  undefined8 local_268;
  float *local_260;
  int local_258;
  int local_254;
  int local_250;
  binary_op_add local_249 [9];
  long *local_240;
  long *local_238;
  long *local_230;
  undefined1 local_225;
  int local_224;
  undefined8 *local_218;
  undefined1 local_20d;
  int local_20c;
  undefined8 *local_200;
  undefined8 *local_1f8;
  undefined8 *local_1f0;
  undefined8 *local_1d8;
  undefined8 *local_1d0;
  undefined8 *local_1c8;
  undefined1 local_1bd;
  int local_1bc;
  undefined8 *local_1b0;
  undefined8 *local_1a0;
  float *local_198;
  float *local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  float *local_170;
  long local_168;
  undefined4 local_15c;
  long local_158;
  float *local_150;
  undefined4 local_144;
  int local_140;
  int local_13c;
  undefined8 *local_138;
  long local_130;
  undefined4 local_124;
  long local_120;
  float *local_118;
  undefined4 local_10c;
  int local_108;
  int local_104;
  undefined8 *local_100;
  long local_f8;
  undefined4 local_ec;
  long local_e8;
  float *local_e0;
  undefined4 local_d4;
  int local_d0;
  int local_cc;
  undefined8 *local_c8;
  undefined4 local_bc;
  long local_b8;
  undefined4 local_ac;
  long local_a8;
  undefined4 local_9c;
  long local_98;
  undefined8 *local_78;
  undefined8 *local_68;
  undefined8 *local_58;
  
  local_250 = (int)in_RDI[7];
  local_254 = *(int *)((long)in_RDI + 0x2c) * (int)in_RDI[6] * *(int *)((long)in_RDI + 0x34) *
              (int)in_RDI[3];
  local_240 = in_RDX;
  local_238 = in_RSI;
  local_230 = in_RDI;
  for (local_258 = 0; local_258 < local_250; local_258 = local_258 + 1) {
    local_200 = &local_2a8;
    local_104 = *(int *)((long)local_230 + 0x2c);
    local_108 = (int)local_230[6];
    local_10c = *(undefined4 *)((long)local_230 + 0x34);
    local_260 = (float *)(*local_230 + local_230[8] * (long)local_258 * local_230[2]);
    local_120 = local_230[2];
    local_124 = (undefined4)local_230[3];
    local_130 = local_230[4];
    local_100 = &local_2a8;
    local_a8 = (long)local_104 * (long)local_108 * local_120;
    local_1f0 = &local_2a8;
    local_1d8 = &local_2a8;
    local_218 = &local_2f8;
    local_cc = *(int *)((long)local_238 + 0x2c);
    local_d0 = (int)local_238[6];
    local_d4 = *(undefined4 *)((long)local_238 + 0x34);
    local_2b0 = (float *)(*local_238 + local_238[8] * (long)local_258 * local_238[2]);
    local_e8 = local_238[2];
    local_ec = (undefined4)local_238[3];
    local_f8 = local_238[4];
    local_c8 = &local_2f8;
    local_b8 = (long)local_cc * (long)local_d0 * local_e8;
    local_1f8 = &local_2f8;
    local_1d0 = &local_2f8;
    local_1b0 = &local_348;
    local_13c = *(int *)((long)local_240 + 0x2c);
    local_140 = (int)local_240[6];
    local_144 = *(undefined4 *)((long)local_240 + 0x34);
    local_300 = (float *)(*local_240 + local_240[8] * (long)local_258 * local_240[2]);
    local_158 = local_240[2];
    local_15c = (undefined4)local_240[3];
    local_168 = local_240[4];
    local_138 = &local_348;
    local_98 = (long)local_13c * (long)local_140 * local_158;
    local_1a0 = &local_348;
    local_1c8 = &local_348;
    local_270 = 0;
    local_274 = 0;
    local_278 = 0;
    local_27c = 0;
    local_290 = 0;
    local_298 = 0;
    local_2a0 = 0;
    local_2a8 = 0;
    local_2c0 = 0;
    local_2c4 = 0;
    local_2c8 = 0;
    local_2cc = 0;
    local_2e0 = 0;
    local_2e8 = 0;
    local_2f0 = 0;
    local_2f8 = 0;
    local_9c = 0x10;
    local_ac = 0x10;
    local_bc = 0x10;
    local_1bc = local_258;
    local_1bd = 1;
    local_20c = local_258;
    local_20d = 1;
    local_224 = local_258;
    local_225 = 1;
    local_268 = 0;
    local_280 = 0;
    local_2b8 = 0;
    local_2d0 = 0;
    local_348 = 0;
    local_338 = 0;
    local_330 = 0;
    local_320 = 0;
    local_31c = 0;
    local_318 = 0;
    local_314 = 0;
    local_310 = 0;
    local_308 = 0;
    local_340 = 0;
    local_150 = local_300;
    local_118 = local_260;
    local_e0 = local_2b0;
    local_78 = local_1c8;
    local_68 = local_1d0;
    local_58 = local_1d8;
    local_328 = local_168;
    local_2d8 = local_f8;
    local_288 = local_130;
    for (local_34c = 0; local_34c + 3 < local_254; local_34c = local_34c + 4) {
      local_190 = local_260;
      local_368 = *(float (*) [2])local_260;
      afStack_360._0_8_ = *(undefined8 *)(local_260 + 2);
      local_198 = local_2b0;
      local_378 = *(float (*) [2])local_2b0;
      afStack_370 = *(float (*) [2])(local_2b0 + 2);
      afVar3 = BinaryOp_x86_functor::binary_op_add::func_pack4
                         (local_249,(__m128 *)local_368,(__m128 *)local_378);
      local_188 = afVar3._0_8_;
      auVar1._8_4_ = extraout_XMM0_Dc;
      auVar1._0_8_ = local_188;
      auVar1._12_4_ = extraout_XMM0_Dd;
      local_170 = local_300;
      uStack_380 = auVar1._8_8_;
      uStack_180 = uStack_380;
      *(undefined8 *)local_300 = local_188;
      *(undefined8 *)(local_300 + 2) = uStack_380;
      local_260 = local_260 + 4;
      local_2b0 = local_2b0 + 4;
      local_300 = local_300 + 4;
    }
    for (; local_34c < local_254; local_34c = local_34c + 1) {
      fVar2 = BinaryOp_x86_functor::binary_op_add::func(local_249,local_260,local_2b0);
      *local_300 = fVar2;
      local_260 = local_260 + 1;
      local_2b0 = local_2b0 + 1;
      local_300 = local_300 + 1;
    }
  }
  return 0;
}

Assistant:

static int binary_op_no_broadcast(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    const int channels = a.c;
    const int size = a.w * a.h * a.d * a.elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}